

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

bool __thiscall
wasm::analysis::Vector<wasm::RandomLattice>::joinAtIndex
          (Vector<wasm::RandomLattice> *this,Element *joinee,size_t i,Element *elem)

{
  bool bVar1;
  reference a;
  Element *elem_local;
  size_t i_local;
  Element *joinee_local;
  Vector<wasm::RandomLattice> *this_local;
  
  a = std::
      vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
      ::operator[](joinee,i);
  bVar1 = RandomLattice::join(&this->lattice,a,elem);
  return bVar1;
}

Assistant:

bool joinAtIndex(Element& joinee,
                   size_t i,
                   const typename L::Element& elem) const noexcept {
    if constexpr (std::is_same_v<typename L::Element, bool>) {
      // The vector<bool> specialization does not expose references to the
      // individual bools because they might be in a bitmap, so we need a
      // workaround.
      bool e = joinee[i];
      if (lattice.join(e, elem)) {
        joinee[i] = e;
        return true;
      }
      return false;
    } else {
      return lattice.join(joinee[i], elem);
    }
  }